

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O2

bool MatchHeader(char *label,char *hdata)

{
  int iVar1;
  size_t sVar2;
  size_t __n;
  
  iVar1 = bcmp(hdata,"LEVEL=",6);
  if (iVar1 == 0) {
    sVar2 = strlen(label);
    __n = 8;
    if (sVar2 < 8) {
      __n = sVar2;
    }
    iVar1 = strncasecmp(hdata + 6,label,__n);
    if (iVar1 == 0) {
      return hdata[__n + 6] == '\n' || hdata[__n + 6] == '\r';
    }
  }
  return false;
}

Assistant:

static bool MatchHeader(const char * label, const char * hdata)
{
	if (memcmp(hdata, "LEVEL=", 6) == 0)
	{
		size_t labellen = strlen(label);
		labellen = MIN(size_t(8), labellen);

		if (strnicmp(hdata+6, label, labellen)==0 && 
			(hdata[6+labellen]==0xa || hdata[6+labellen]==0xd))
		{
			return true;
		}
	}
	return false;
}